

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_spv_amd_shader_explicit_vertex_parameter_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t id,uint32_t eop,uint32_t *args,
          uint32_t param_5)

{
  allocator local_55;
  uint32_t local_54;
  string local_50;
  
  local_54 = eop;
  ::std::__cxx11::string::string
            ((string *)&local_50,"GL_AMD_shader_explicit_vertex_parameter",&local_55);
  require_extension_internal(this,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  if (eop == 1) {
    emit_binary_func_op(this,result_type,id,*args,args[1],"interpolateAtVertexAMD");
  }
  else {
    statement<char_const(&)[62],unsigned_int&>
              (this,(char (*) [62])"// unimplemented SPV AMD shader explicit vertex parameter op ",
               &local_54);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_spv_amd_shader_explicit_vertex_parameter_op(uint32_t result_type, uint32_t id, uint32_t eop,
                                                                    const uint32_t *args, uint32_t)
{
	require_extension_internal("GL_AMD_shader_explicit_vertex_parameter");

	enum AMDShaderExplicitVertexParameter
	{
		InterpolateAtVertexAMD = 1
	};

	auto op = static_cast<AMDShaderExplicitVertexParameter>(eop);

	switch (op)
	{
	case InterpolateAtVertexAMD:
		emit_binary_func_op(result_type, id, args[0], args[1], "interpolateAtVertexAMD");
		break;

	default:
		statement("// unimplemented SPV AMD shader explicit vertex parameter op ", eop);
		break;
	}
}